

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  anon_struct_16_2_f8ada542 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  undefined8 local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_50;
  undefined8 local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *puStack_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_68 = 0;
  sStack_60 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 2;
  puStack_20 = (undefined1 *)&local_68;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_40 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_50);
  if (*(sysbvm_tuple_t *)(*arguments + 0x38) != 0) {
    sStack_60 = sysbvm_interpreter_evaluateASTWithEnvironment
                          (context,*(sysbvm_tuple_t *)(*arguments + 0x38),arguments[1]);
  }
  if (*(long *)(*arguments + 0x50) == 0x1f) {
    sStack_60 = sysbvm_referenceType_withBoxForValue
                          (context,*(sysbvm_tuple_t *)(*arguments + 0x20),sStack_60);
  }
  sysbvm_functionActivationEnvironment_setBindingActivationValue
            (context,arguments[1],*(sysbvm_tuple_t *)(*arguments + 0x40),sStack_60,
             *(sysbvm_tuple_t *)(*arguments + 0x10));
  sysbvm_stackFrame_popRecord(&local_50);
  sysbvm_stackFrame_popRecord(&local_38);
  return sStack_60;
}

Assistant:

static sysbvm_tuple_t sysbvm_astVariableDefinitionNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t type;
        sysbvm_tuple_t value;
    } gcFrame = {
        .value = SYSBVM_NULL_TUPLE
    };

    sysbvm_astVariableDefinitionNode_t **variableDefinitionNode = (sysbvm_astVariableDefinitionNode_t**)node;

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*variableDefinitionNode)->super.sourcePosition);

    if((*variableDefinitionNode)->valueExpression)
        gcFrame.value = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*variableDefinitionNode)->valueExpression, *environment);

    bool isMutable = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isMutable);
    if(isMutable)
        gcFrame.value = sysbvm_referenceType_withBoxForValue(context, (*variableDefinitionNode)->super.analyzedType, gcFrame.value);

    sysbvm_functionActivationEnvironment_setBindingActivationValue(context, *environment, (*variableDefinitionNode)->binding, gcFrame.value, (*variableDefinitionNode)->super.sourcePosition);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.value;
}